

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int local_5c;
  int local_58;
  int status;
  int i;
  int exec_errorno;
  int err;
  pid_t pid;
  ssize_t r;
  int (*paiStack_38) [2];
  int stdio_count;
  int (*pipes) [2];
  int signal_pipe [2];
  uv_process_options_t *options_local;
  uv_process_t *process_local;
  uv_loop_t *loop_local;
  
  pipes = (int (*) [2])0xffffffffffffffff;
  signal_pipe = (int  [2])options;
  if (options->file == (char *)0x0) {
    __assert_fail("options->file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x193,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if ((options->flags & 0xffffffe0) != 0) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                  ,0x198,"int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  process->loop = loop;
  process->type = UV_PROCESS;
  process->flags = 0x2000;
  process->handle_queue[0] = loop->handle_queue;
  process->handle_queue[1] = loop->handle_queue[1];
  *(void ***)process->handle_queue[1] = process->handle_queue;
  loop->handle_queue[1] = process->handle_queue;
  process->next_closing = (uv_handle_t *)0x0;
  process->queue[0] = process->queue;
  process->queue[1] = process->queue;
  r._4_4_ = options->stdio_count;
  if (r._4_4_ < 3) {
    r._4_4_ = 3;
  }
  i = -0xc;
  paiStack_38 = (int (*) [2])uv__malloc((long)r._4_4_ << 3);
  if (paiStack_38 != (int (*) [2])0x0) {
    for (local_58 = 0; local_58 < r._4_4_; local_58 = local_58 + 1) {
      paiStack_38[local_58][0] = -1;
      paiStack_38[local_58][1] = -1;
    }
    for (local_58 = 0; local_58 < *(int *)((long)signal_pipe + 0x2c); local_58 = local_58 + 1) {
      i = uv__process_init_stdio
                    ((uv_stdio_container_t *)
                     (*(long *)((long)signal_pipe + 0x30) + (long)local_58 * 0x10),
                     paiStack_38[local_58]);
      if (i != 0) goto LAB_00a0cdf6;
      i = 0;
    }
    i = uv__make_pipe((int *)&pipes,0);
    if (i == 0) {
      uv_signal_start(&loop->child_watcher,uv__chld,0x11);
      uv_rwlock_wrlock(&loop->cloexec_lock);
      exec_errorno = fork();
      if (exec_errorno == -1) {
        piVar1 = __errno_location();
        i = -*piVar1;
        uv_rwlock_wrunlock(&loop->cloexec_lock);
        uv__close((int)pipes);
        uv__close(pipes._4_4_);
      }
      else {
        if (exec_errorno == 0) {
          uv__process_child_init
                    ((uv_process_options_t *)signal_pipe,r._4_4_,paiStack_38,pipes._4_4_);
          abort();
        }
        uv_rwlock_wrunlock(&loop->cloexec_lock);
        uv__close(pipes._4_4_);
        process->status = 0;
        status = 0;
        do {
          _err = read((int)pipes,&status,4);
          bVar3 = false;
          if (_err == -1) {
            piVar1 = __errno_location();
            bVar3 = *piVar1 == 4;
          }
        } while (bVar3);
        if (_err != 0) {
          if (_err == 4) {
            do {
              i = waitpid(exec_errorno,&local_5c,0);
              bVar3 = false;
              if (i == -1) {
                piVar1 = __errno_location();
                bVar3 = *piVar1 == 4;
              }
            } while (bVar3);
            if (i != exec_errorno) {
              __assert_fail("err == pid",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                            ,0x1ec,
                            "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)"
                           );
            }
          }
          else {
            if ((_err != -1) || (piVar1 = __errno_location(), *piVar1 != 0x20)) {
              abort();
            }
            do {
              i = waitpid(exec_errorno,&local_5c,0);
              bVar3 = false;
              if (i == -1) {
                piVar1 = __errno_location();
                bVar3 = *piVar1 == 4;
              }
            } while (bVar3);
            if (i != exec_errorno) {
              __assert_fail("err == pid",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/process.c"
                            ,0x1f1,
                            "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)"
                           );
            }
          }
        }
        uv__close_nocheckstdio((int)pipes);
        local_58 = 0;
        while( true ) {
          if (*(int *)((long)signal_pipe + 0x2c) <= local_58) {
            if (status == 0) {
              process->queue[0] = loop->process_handles;
              process->queue[1] = loop->process_handles[1];
              *(void ***)process->queue[1] = process->queue;
              loop->process_handles[1] = process->queue;
              if (((process->flags & 0x4000) == 0) &&
                 (process->flags = process->flags | 0x4000, (process->flags & 0x2000) != 0)) {
                process->loop->active_handles = process->loop->active_handles + 1;
              }
            }
            process->pid = exec_errorno;
            process->exit_cb = *(uv_exit_cb *)signal_pipe;
            uv__free(paiStack_38);
            return status;
          }
          i = uv__process_open_stream
                        ((uv_stdio_container_t *)
                         (*(long *)((long)signal_pipe + 0x30) + (long)local_58 * 0x10),
                         paiStack_38[local_58],(uint)(local_58 == 0));
          if (i != 0) break;
          local_58 = local_58 + 1;
          i = 0;
        }
        while (iVar2 = local_58 + -1, local_58 != 0) {
          local_58 = iVar2;
          uv__process_close_stream
                    ((uv_stdio_container_t *)
                     (*(long *)((long)signal_pipe + 0x30) + (long)iVar2 * 0x10));
        }
      }
    }
  }
LAB_00a0cdf6:
  if (paiStack_38 != (int (*) [2])0x0) {
    for (local_58 = 0; local_58 < r._4_4_; local_58 = local_58 + 1) {
      if ((*(int *)((long)signal_pipe + 0x2c) <= local_58) ||
         ((*(uint *)(*(long *)((long)signal_pipe + 0x30) + (long)local_58 * 0x10) & 6) == 0)) {
        if (paiStack_38[local_58][0] != -1) {
          uv__close_nocheckstdio(paiStack_38[local_58][0]);
        }
        if (paiStack_38[local_58][1] != -1) {
          uv__close_nocheckstdio(paiStack_38[local_58][1]);
        }
      }
    }
    uv__free(paiStack_38);
  }
  return i;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
#if defined(__APPLE__) && (TARGET_OS_TV || TARGET_OS_WATCH)
  /* fork is marked __WATCHOS_PROHIBITED __TVOS_PROHIBITED. */
  return -ENOSYS;
#else
  int signal_pipe[2] = { -1, -1 };
  int (*pipes)[2];
  int stdio_count;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;
  int status;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = -ENOMEM;
  pipes = uv__malloc(stdio_count * sizeof(*pipes));
  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  /* Acquire write lock to prevent opening new fds in worker threads */
  uv_rwlock_wrlock(&loop->cloexec_lock);
  pid = fork();

  if (pid == -1) {
    err = -errno;
    uv_rwlock_wrunlock(&loop->cloexec_lock);
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  /* Release lock in parent process */
  uv_rwlock_wrunlock(&loop->cloexec_lock);
  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno)) {
    do
      err = waitpid(pid, &status, 0); /* okay, read errorno */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else if (r == -1 && errno == EPIPE) {
    do
      err = waitpid(pid, &status, 0); /* okay, got EPIPE */
    while (err == -1 && errno == EINTR);
    assert(err == pid);
  } else
    abort();

  uv__close_nocheckstdio(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i], i == 0);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    QUEUE_INSERT_TAIL(&loop->process_handles, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  uv__free(pipes);
  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        uv__close_nocheckstdio(pipes[i][0]);
      if (pipes[i][1] != -1)
        uv__close_nocheckstdio(pipes[i][1]);
    }
    uv__free(pipes);
  }

  return err;
#endif
}